

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkedAllocator.c
# Opt level: O0

void sysbvm_chunkedAllocator_allocateWithDualMapping
               (sysbvm_chunkedAllocator_t *allocator,size_t size,size_t alignment,
               void **writeableMapping,void **executableMapping)

{
  _Bool _Var1;
  sysbvm_chunkedAllocatorChunk_t *psVar2;
  size_t sVar3;
  size_t alignedOffset;
  sysbvm_chunkedAllocatorChunk_t *chunk;
  void **executableMapping_local;
  void **writeableMapping_local;
  size_t alignment_local;
  size_t size_local;
  sysbvm_chunkedAllocator_t *allocator_local;
  
  psVar2 = sysbvm_chunkedAllocator_ensureChunkWithRequiredCapacity(allocator,size,alignment);
  if (psVar2 == (sysbvm_chunkedAllocatorChunk_t *)0x0) {
    sysbvm_error_assertionFailure
              (
              "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/chunkedAllocator.c:125: assertion failure: chunk"
              );
  }
  sVar3 = sysbvm_chunkedAllocator_sizeAlignedTo(psVar2->size,alignment);
  if (writeableMapping != (void **)0x0) {
    *writeableMapping = (void *)((long)&psVar2->writeableMapping[1].previous + sVar3);
  }
  if (executableMapping != (void **)0x0) {
    *executableMapping = (void *)((long)&psVar2->executableMapping[1].previous + sVar3);
  }
  _Var1 = sysbvm_virtualMemory_lockCodePagesForWriting
                    (psVar2->writeableMapping,psVar2->executableMapping,0x40);
  if (!_Var1) {
    abort();
  }
  psVar2->size = sVar3 + size;
  if (psVar2->capacity < psVar2->size) {
    sysbvm_error_assertionFailure
              (
              "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/chunkedAllocator.c:137: assertion failure: chunk->size <= chunk->capacity"
              );
  }
  sysbvm_virtualMemory_unlockCodePagesForExecution
            (psVar2->writeableMapping,psVar2->executableMapping,0x40);
  return;
}

Assistant:

SYSBVM_API void sysbvm_chunkedAllocator_allocateWithDualMapping(sysbvm_chunkedAllocator_t *allocator, size_t size, size_t alignment, void **writeableMapping, void **executableMapping)
{

    sysbvm_chunkedAllocatorChunk_t *chunk = sysbvm_chunkedAllocator_ensureChunkWithRequiredCapacity(allocator, size, alignment);
    SYSBVM_ASSERT(chunk);

    size_t alignedOffset = sysbvm_chunkedAllocator_sizeAlignedTo(chunk->size, alignment);
    if(writeableMapping)
        *writeableMapping = (uint8_t*)(chunk->writeableMapping + 1) + alignedOffset;
    if(executableMapping)
        *executableMapping = (uint8_t*)(chunk->executableMapping + 1) + alignedOffset;

    if(!sysbvm_virtualMemory_lockCodePagesForWriting(chunk->writeableMapping, chunk->executableMapping, sizeof(sysbvm_chunkedAllocatorChunk_t)))
        abort();

    chunk->size = alignedOffset + size;
    SYSBVM_ASSERT(chunk->size <= chunk->capacity);

    sysbvm_virtualMemory_unlockCodePagesForExecution(chunk->writeableMapping, chunk->executableMapping, sizeof(sysbvm_chunkedAllocatorChunk_t));
}